

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

void __thiscall
duckdb_jaro_winkler::common::BlockPatternMatchVector::BlockPatternMatchVector<char_const*>
          (BlockPatternMatchVector *this,char *first,char *last)

{
  (this->m_extendedAscii).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_extendedAscii).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_map).
  super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_extendedAscii).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_map).
  super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_map).
  super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_block_count = 0;
  insert<char_const*>(this,first,last);
  return;
}

Assistant:

BlockPatternMatchVector(InputIt1 first, InputIt1 last) : m_block_count(0)
    {
        insert(first, last);
    }